

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

void __thiscall
FIX::HttpConnection::showRow
          (HttpConnection *this,stringstream *s,string *name,int value,string *url)

{
  ostream *poVar1;
  TAG *pTVar2;
  string local_1658;
  undefined1 local_1638 [8];
  A a_3;
  stringstream href_3;
  ostream local_1470 [376];
  string local_12f8;
  undefined1 local_12d8 [8];
  A a_2;
  stringstream href_2;
  ostream local_1110 [376];
  string local_f98;
  undefined1 local_f78 [8];
  A a_1;
  stringstream href_1;
  ostream local_db0 [376];
  string local_c38;
  undefined1 local_c18 [8];
  A a;
  stringstream href;
  ostream local_a50 [376];
  undefined1 local_8d8 [8];
  CENTER center;
  TD td_2;
  TD td_1;
  TD td;
  undefined1 local_1e8 [8];
  TR tr;
  string *url_local;
  string *psStack_20;
  int value_local;
  string *name_local;
  stringstream *s_local;
  HttpConnection *this_local;
  
  tr.super_TAG.m_stream = (ostream *)url;
  url_local._4_4_ = value;
  psStack_20 = name;
  name_local = (string *)s;
  s_local = (stringstream *)this;
  HTML::TR::TR((TR *)local_1e8,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)local_1e8);
  HTML::TD::TD((TD *)&td_1.super_TAG.m_stream,(ostream *)(name_local->field_2)._M_local_buf);
  HTML::TAG::text<std::__cxx11::string>((TAG *)&td_1.super_TAG.m_stream,psStack_20);
  HTML::TD::~TD((TD *)&td_1.super_TAG.m_stream);
  HTML::TD::TD((TD *)&td_2.super_TAG.m_stream,(ostream *)(name_local->field_2)._M_local_buf);
  HTML::TAG::text<int>((TAG *)&td_2.super_TAG.m_stream,(int *)((long)&url_local + 4));
  HTML::TD::~TD((TD *)&td_2.super_TAG.m_stream);
  HTML::TD::TD((TD *)&center.super_TAG.m_stream,(ostream *)(name_local->field_2)._M_local_buf);
  HTML::TAG::text((TAG *)&center.super_TAG.m_stream);
  HTML::CENTER::CENTER((CENTER *)local_8d8,(ostream *)(name_local->field_2)._M_local_buf);
  HTML::TAG::text((TAG *)local_8d8);
  std::__cxx11::stringstream::stringstream((stringstream *)&a.super_TAG.m_stream);
  poVar1 = std::operator<<(local_a50,(string *)tr.super_TAG.m_stream);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)psStack_20);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,url_local._4_4_ + -10);
  HTML::A::A((A *)local_c18,(ostream *)(name_local->field_2)._M_local_buf);
  std::__cxx11::stringstream::str();
  pTVar2 = &HTML::A::href((A *)local_c18,&local_c38)->super_TAG;
  HTML::TAG::text<char[3]>(pTVar2,(char (*) [3])"<<");
  std::__cxx11::string::~string((string *)&local_c38);
  HTML::A::~A((A *)local_c18);
  std::__cxx11::stringstream::~stringstream((stringstream *)&a.super_TAG.m_stream);
  std::operator<<((ostream *)(name_local->field_2)._M_local_buf,HTML::NBSP);
  std::__cxx11::stringstream::stringstream((stringstream *)&a_1.super_TAG.m_stream);
  poVar1 = std::operator<<(local_db0,(string *)tr.super_TAG.m_stream);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)psStack_20);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,url_local._4_4_ + -1);
  HTML::A::A((A *)local_f78,(ostream *)(name_local->field_2)._M_local_buf);
  std::__cxx11::stringstream::str();
  pTVar2 = &HTML::A::href((A *)local_f78,&local_f98)->super_TAG;
  HTML::TAG::text<char[2]>(pTVar2,(char (*) [2])0x2dc15a);
  std::__cxx11::string::~string((string *)&local_f98);
  HTML::A::~A((A *)local_f78);
  std::__cxx11::stringstream::~stringstream((stringstream *)&a_1.super_TAG.m_stream);
  poVar1 = std::operator<<((ostream *)(name_local->field_2)._M_local_buf,HTML::NBSP);
  poVar1 = std::operator<<(poVar1,"|");
  std::operator<<(poVar1,HTML::NBSP);
  std::__cxx11::stringstream::stringstream((stringstream *)&a_2.super_TAG.m_stream);
  poVar1 = std::operator<<(local_1110,(string *)tr.super_TAG.m_stream);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)psStack_20);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,url_local._4_4_ + 1);
  HTML::A::A((A *)local_12d8,(ostream *)(name_local->field_2)._M_local_buf);
  std::__cxx11::stringstream::str();
  pTVar2 = &HTML::A::href((A *)local_12d8,&local_12f8)->super_TAG;
  HTML::TAG::text<char[2]>(pTVar2,(char (*) [2])0x2dc773);
  std::__cxx11::string::~string((string *)&local_12f8);
  HTML::A::~A((A *)local_12d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&a_2.super_TAG.m_stream);
  std::operator<<((ostream *)(name_local->field_2)._M_local_buf,HTML::NBSP);
  std::__cxx11::stringstream::stringstream((stringstream *)&a_3.super_TAG.m_stream);
  poVar1 = std::operator<<(local_1470,(string *)tr.super_TAG.m_stream);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)psStack_20);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,url_local._4_4_ + 10);
  HTML::A::A((A *)local_1638,(ostream *)(name_local->field_2)._M_local_buf);
  std::__cxx11::stringstream::str();
  pTVar2 = &HTML::A::href((A *)local_1638,&local_1658)->super_TAG;
  HTML::TAG::text<char[3]>(pTVar2,(char (*) [3])">>");
  std::__cxx11::string::~string((string *)&local_1658);
  HTML::A::~A((A *)local_1638);
  std::__cxx11::stringstream::~stringstream((stringstream *)&a_3.super_TAG.m_stream);
  HTML::CENTER::~CENTER((CENTER *)local_8d8);
  HTML::TD::~TD((TD *)&center.super_TAG.m_stream);
  HTML::TR::~TR((TR *)local_1e8);
  return;
}

Assistant:

void HttpConnection::showRow(std::stringstream &s, const std::string &name, int value, const std::string &url) {
  {
    TR tr(s);
    tr.text();
    {
      TD td(s);
      td.text(name);
    }
    {
      TD td(s);
      td.text(value);
    }
    {
      TD td(s);
      td.text();
      CENTER center(s);
      center.text();
      {
        std::stringstream href;
        href << url << "&" << name << "=" << value - 10;
        A a(s);
        a.href(href.str()).text("<<");
      }
      s << NBSP;
      {
        std::stringstream href;
        href << url << "&" << name << "=" << value - 1;
        A a(s);
        a.href(href.str()).text("<");
      }
      s << NBSP << "|" << NBSP;
      {
        std::stringstream href;
        href << url << "&" << name << "=" << value + 1;
        A a(s);
        a.href(href.str()).text(">");
      }
      s << NBSP;
      {
        std::stringstream href;
        href << url << "&" << name << "=" << value + 10;
        A a(s);
        a.href(href.str()).text(">>");
      }
    }
  }
}